

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O3

char * util_shortname(char *path)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *extraout_RAX;
  char *pcVar4;
  ulong uVar5;
  int extraout_EDX;
  long lVar6;
  long in_RSI;
  
  if (path != (char *)0x0) {
    pcVar3 = strrchr(path,0x2f);
    pcVar4 = pcVar3 + 1;
    if (pcVar3 == (char *)0x0) {
      pcVar4 = path;
    }
    return pcVar4;
  }
  util_shortname_cold_1();
  if (extraout_EDX < 0x3a) {
    if (extraout_EDX == -1) {
      uVar5 = (ulong)(uint)util_optind;
      lVar6 = (long)util_optind;
      pcVar4 = *(char **)(in_RSI + -8 + lVar6 * 8);
      if (((*pcVar4 == '-') && (pcVar4[1] == '-')) && (pcVar4[2] == '\0')) {
        lVar6 = *(long *)(in_RSI + lVar6 * 8);
        while (lVar6 != 0) {
          util_optind = (int)uVar5 + 1;
          iVar1 = *(int *)path;
          *(int *)path = iVar1 + 1;
          *(long *)(in_RSI + (long)iVar1 * 8) = lVar6;
          uVar5 = (ulong)util_optind;
          lVar6 = *(long *)(in_RSI + uVar5 * 8);
        }
      }
      else {
        util_optind = util_optind + 1;
        uVar2 = *(undefined8 *)(in_RSI + lVar6 * 8);
        iVar1 = *(int *)path;
        *(int *)path = iVar1 + 1;
        *(undefined8 *)(in_RSI + (long)iVar1 * 8) = uVar2;
      }
    }
    return extraout_RAX;
  }
  if (extraout_EDX == 0x3a) {
    util_getopt_default_cold_2();
  }
  else if (extraout_EDX != 0x3f) {
    if (extraout_EDX != 0x56) {
      return extraout_RAX;
    }
    goto LAB_001091bc;
  }
  util_getopt_default_cold_1();
LAB_001091bc:
  util_print_version();
  exit(0);
}

Assistant:

const char *
util_shortname(
    const char *path)
{
    const char *ret;
    if (!path) {
        fprintf(stderr, "%s: NULL path passed to short_name\n", argv0);
        abort();
    }
    ret = strrchr(path, '/');
#ifdef _WIN32
    {
        const char *p = strrchr(path, '\\');
        ret = MAX(ret, p);
    }
#endif
    return ret ? ret + 1 : path;
}